

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O1

void __thiscall
iu_AssertionTest_x_iutest_x_ScopedTrace_Test::Body
          (iu_AssertionTest_x_iutest_x_ScopedTrace_Test *this)

{
  iuStreamMessage *piVar1;
  int x;
  ScopedMessage scoped_message_0;
  ScopedMessage scoped_message_1;
  int local_39c;
  iuCodeMessage local_398;
  iuCodeMessage local_368;
  undefined1 local_338 [392];
  undefined1 local_1b0 [392];
  
  local_39c = 100;
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_338);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1b0);
  piVar1 = iutest::detail::iuStreamMessage::operator<<
                     ((iuStreamMessage *)local_1b0,(char (*) [3])"x=");
  piVar1 = iutest::detail::iuStreamMessage::operator<<(piVar1,&local_39c);
  iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_338,piVar1);
  std::__cxx11::stringbuf::str();
  local_368.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
  ;
  local_368.m_line = 0x118;
  iutest::AssertionHelper::ScopedMessage::ScopedMessage((ScopedMessage *)&local_398,&local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.m_message._M_dataplus._M_p != &local_368.m_message.field_2) {
    operator_delete(local_368.m_message._M_dataplus._M_p,
                    local_368.m_message.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
  std::__cxx11::stringstream::~stringstream((stringstream *)local_338);
  std::ios_base::~ios_base((ios_base *)(local_338 + 0x80));
  iutest::AssertionHelper::ScopedMessage::~ScopedMessage((ScopedMessage *)&local_398);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_338);
  iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_338,(char (*) [5])0x3313c1);
  std::__cxx11::stringbuf::str();
  local_398.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
  ;
  local_398.m_line = 0x11b;
  iutest::AssertionHelper::ScopedMessage::ScopedMessage((ScopedMessage *)local_1b0,&local_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398.m_message._M_dataplus._M_p != &local_398.m_message.field_2) {
    operator_delete(local_398.m_message._M_dataplus._M_p,
                    local_398.m_message.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_338);
  std::ios_base::~ios_base((ios_base *)(local_338 + 0x80));
  iutest::AssertionHelper::ScopedMessage::~ScopedMessage((ScopedMessage *)local_1b0);
  return;
}

Assistant:

IUTEST(AssertionTest, ScopedTrace)
{
    {
        int x=100;
        IUTEST_SCOPED_TRACE(::iutest::Message() << "x=" << x);
    }
    {
        IUTEST_SCOPED_TRACE("test");
    }
}